

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn_00;
  int iVar1;
  tftp_state_data *state_00;
  uchar *puVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  char local_148 [8];
  char buffer [256];
  int rc;
  connectdata *conn;
  int need_blksize;
  int blksize;
  tftp_state_data *state;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  conn._4_4_ = 0x200;
  auVar5 = (undefined1  [16])(*Curl_ccalloc)(1,0x160);
  state_00 = auVar5._0_8_;
  (conn_00->proto).tftpc = state_00;
  if (state_00 == (tftp_state_data *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((data->set).tftp_blksize != 0) {
      conn._4_4_ = (uint)(data->set).tftp_blksize;
    }
    conn._0_4_ = conn._4_4_;
    if ((int)conn._4_4_ < 0x200) {
      conn._0_4_ = 0x200;
    }
    if ((state_00->rpacket).data == (uchar *)0x0) {
      auVar5 = (undefined1  [16])(*Curl_ccalloc)(1,(long)(int)((uint)conn + 4));
      (state_00->rpacket).data = auVar5._0_8_;
      if ((state_00->rpacket).data == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((state_00->spacket).data == (uchar *)0x0) {
      puVar2 = (uchar *)(*Curl_ccalloc)(1,(long)(int)((uint)conn + 4));
      (state_00->spacket).data = puVar2;
      if ((state_00->spacket).data == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    Curl_conncontrol(conn_00,1);
    state_00->data = data;
    state_00->sockfd = conn_00->sock[0];
    state_00->state = TFTP_STATE_START;
    state_00->error = TFTP_ERR_NONE;
    state_00->blksize = 0x200;
    state_00->requested_blksize = conn._4_4_;
    (state_00->local_addr).buffer.sa.sa_family = (sa_family_t)conn_00->remote_addr->family;
    tftp_set_timeouts(state_00);
    if (((ulong)conn_00->bits >> 0x14 & 1) == 0) {
      buffer._248_8_ = &state_00->local_addr;
      iVar1 = bind(state_00->sockfd,(sockaddr *)buffer._248_8_,conn_00->remote_addr->addrlen);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = Curl_strerror(*piVar3,local_148,0x100);
        Curl_failf(data,"bind() failed; %s",pcVar4);
        return CURLE_COULDNT_CONNECT;
      }
      conn_00->bits = (ConnectBits)((ulong)conn_00->bits & 0xffffffffffefffff | 0x100000);
    }
    Curl_pgrsStartNow(data);
    *done = true;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode tftp_connect(struct Curl_easy *data, bool *done)
{
  struct tftp_state_data *state;
  int blksize;
  int need_blksize;
  struct connectdata *conn = data->conn;

  blksize = TFTP_BLKSIZE_DEFAULT;

  state = conn->proto.tftpc = calloc(1, sizeof(struct tftp_state_data));
  if(!state)
    return CURLE_OUT_OF_MEMORY;

  /* alloc pkt buffers based on specified blksize */
  if(data->set.tftp_blksize)
    /* range checked when set */
    blksize = (int)data->set.tftp_blksize;

  need_blksize = blksize;
  /* default size is the fallback when no OACK is received */
  if(need_blksize < TFTP_BLKSIZE_DEFAULT)
    need_blksize = TFTP_BLKSIZE_DEFAULT;

  if(!state->rpacket.data) {
    state->rpacket.data = calloc(1, need_blksize + 2 + 2);

    if(!state->rpacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!state->spacket.data) {
    state->spacket.data = calloc(1, need_blksize + 2 + 2);

    if(!state->spacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  /* we do not keep TFTP connections up basically because there is none or
   * little gain for UDP */
  connclose(conn, "TFTP");

  state->data = data;
  state->sockfd = conn->sock[FIRSTSOCKET];
  state->state = TFTP_STATE_START;
  state->error = TFTP_ERR_NONE;
  state->blksize = TFTP_BLKSIZE_DEFAULT; /* Unless updated by OACK response */
  state->requested_blksize = blksize;

  ((struct sockaddr *)&state->local_addr)->sa_family =
    (CURL_SA_FAMILY_T)(conn->remote_addr->family);

  tftp_set_timeouts(state);

  if(!conn->bits.bound) {
    /* If not already bound, bind to any interface, random UDP port. If it is
     * reused or a custom local port was desired, this has already been done!
     *
     * We once used the size of the local_addr struct as the third argument
     * for bind() to better work with IPv6 or whatever size the struct could
     * have, but we learned that at least Tru64, AIX and IRIX *requires* the
     * size of that argument to match the exact size of a 'sockaddr_in' struct
     * when running IPv4-only.
     *
     * Therefore we use the size from the address we connected to, which we
     * assume uses the same IP version and thus hopefully this works for both
     * IPv4 and IPv6...
     */
    int rc = bind(state->sockfd, (struct sockaddr *)&state->local_addr,
                  (curl_socklen_t)conn->remote_addr->addrlen);
    if(rc) {
      char buffer[STRERROR_LEN];
      failf(data, "bind() failed; %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_COULDNT_CONNECT;
    }
    conn->bits.bound = TRUE;
  }

  Curl_pgrsStartNow(data);

  *done = TRUE;

  return CURLE_OK;
}